

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug_p.h
# Opt level: O2

void QtDebugUtils::formatQEnum<Qt::DropAction>(QDebug *debug,DropAction value)

{
  char *t;
  long in_FS_OFFSET;
  undefined1 local_30 [16];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QMetaObject::indexOfEnumerator((char *)&Qt::staticMetaObject);
  local_30 = QMetaObject::enumerator(0x7b8858);
  t = (char *)QMetaEnum::valueToKey((ulonglong)local_30);
  if (t == (char *)0x0) {
    QDebug::operator<<(debug,value);
  }
  else {
    QDebug::operator<<(debug,t);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void formatQEnum(QDebug &debug, QEnum value)
{
    const QMetaObject *metaObject = qt_getEnumMetaObject(value);
    const QMetaEnum me = metaObject->enumerator(metaObject->indexOfEnumerator(qt_getEnumName(value)));
    if (const char *key = me.valueToKey(int(value)))
        debug << key;
    else
        debug << int(value);
}